

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase51::TestCase51(TestCase51 *this)

{
  TestCase51 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                     ,0x33,"legacy test: CharParsers/ExactString");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_007ccb98;
  return;
}

Assistant:

TEST(CharParsers, ExactString) {
  constexpr auto parser = exactString("foo");

  {
    StringPtr text = "foobar";
    Input input(text.begin(), text.end());
    EXPECT_TRUE(parser(input) != nullptr);
    ASSERT_FALSE(input.atEnd());
    EXPECT_EQ('b', input.current());
  }

  {
    StringPtr text = "bar";
    Input input(text.begin(), text.end());
    EXPECT_TRUE(parser(input) == nullptr);
    EXPECT_FALSE(input.atEnd());
    EXPECT_EQ('b', input.current());
  }
}